

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

void __thiscall cmSourceGroup::~cmSourceGroup(cmSourceGroup *this)

{
  cmSourceGroupInternals *this_00;
  cmSourceGroup *this_local;
  
  this_00 = this->Internal;
  if (this_00 != (cmSourceGroupInternals *)0x0) {
    cmSourceGroupInternals::~cmSourceGroupInternals(this_00);
    operator_delete(this_00,0x18);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            (&this->SourceFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->GroupFiles);
  cmsys::RegularExpression::~RegularExpression(&this->GroupRegex);
  std::__cxx11::string::~string((string *)&this->FullName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmSourceGroup::~cmSourceGroup()
{
  delete this->Internal;
}